

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::forestReMaxCol(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this,int p_col,int len)

{
  Dring *pDVar1;
  fpclass_type *pfVar2;
  fpclass_type *pfVar3;
  int iVar4;
  Dring *pDVar5;
  Dring *pDVar6;
  int *piVar7;
  int iVar8;
  int iVar9;
  long_long_type lVar10;
  long lVar11;
  long lVar12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar14;
  cpp_dec_float<200U,_int,_void> *pcVar15;
  fpclass_type *pfVar16;
  cpp_dec_float<200U,_int,_void> *pcVar17;
  fpclass_type *pfVar18;
  int *piVar19;
  byte bVar20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> vv;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<200U,_int,_void> local_1b8;
  cpp_dec_float<200U,_int,_void> local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar20 = 0;
  if ((Col *)(this->u).col.elem[p_col].next == &(this->u).col) {
    iVar8 = len - (this->u).col.max[p_col];
    if ((this->u).col.size - (this->u).col.used < iVar8) {
      forestPackColumns(this);
      iVar8 = len - (this->u).col.max[p_col];
      pnVar14 = &this->colMemMult;
      local_1b8.fpclass = cpp_dec_float_finite;
      local_1b8.prec_elem = 0x1c;
      local_1b8.data._M_elems[0] = 0;
      local_1b8.data._M_elems[1] = 0;
      local_1b8.data._M_elems[2] = 0;
      local_1b8.data._M_elems[3] = 0;
      local_1b8.data._M_elems[4] = 0;
      local_1b8.data._M_elems[5] = 0;
      local_1b8.data._M_elems[6] = 0;
      local_1b8.data._M_elems[7] = 0;
      local_1b8.data._M_elems[8] = 0;
      local_1b8.data._M_elems[9] = 0;
      local_1b8.data._M_elems[10] = 0;
      local_1b8.data._M_elems[0xb] = 0;
      local_1b8.data._M_elems[0xc] = 0;
      local_1b8.data._M_elems[0xd] = 0;
      local_1b8.data._M_elems[0xe] = 0;
      local_1b8.data._M_elems[0xf] = 0;
      local_1b8.data._M_elems[0x10] = 0;
      local_1b8.data._M_elems[0x11] = 0;
      local_1b8.data._M_elems[0x12] = 0;
      local_1b8.data._M_elems[0x13] = 0;
      local_1b8.data._M_elems[0x14] = 0;
      local_1b8.data._M_elems[0x15] = 0;
      local_1b8.data._M_elems[0x16] = 0;
      local_1b8.data._M_elems[0x17] = 0;
      local_1b8.data._M_elems[0x18] = 0;
      local_1b8.data._M_elems[0x19] = 0;
      local_1b8.data._M_elems._104_5_ = 0;
      local_1b8.data._M_elems[0x1b]._1_3_ = 0;
      local_1b8.exp = 0;
      local_1b8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&local_130,(long)(this->u).col.used,(type *)0x0);
      if (&local_1b8 != &pnVar14->m_backend) {
        pnVar13 = pnVar14;
        pcVar15 = &local_1b8;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          (pcVar15->data)._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
          pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar13 + (ulong)bVar20 * -8 + 4);
          pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar20 * -8 + 4);
        }
        local_1b8.exp = (this->colMemMult).m_backend.exp;
        local_1b8.neg = (this->colMemMult).m_backend.neg;
        local_1b8.fpclass = (this->colMemMult).m_backend.fpclass;
        local_1b8.prec_elem = (this->colMemMult).m_backend.prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&local_1b8,&local_130);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&local_130,(long)len,(type *)0x0);
      pcVar15 = &local_1b8;
      pcVar17 = &local_b0;
      for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
        (pcVar17->data)._M_elems[0] = (pcVar15->data)._M_elems[0];
        pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar20 * -8 + 4);
        pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar20 * -8 + 4);
      }
      local_b0.exp = local_1b8.exp;
      local_b0.neg = local_1b8.neg;
      local_b0.fpclass = local_1b8.fpclass;
      local_b0.prec_elem = local_1b8.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                (&local_b0,&local_130);
      if (local_b0.fpclass != cpp_dec_float_NaN) {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  (&local_130,(long)(this->u).col.size,(type *)0x0);
        iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&local_b0,&local_130);
        if (0 < iVar9) {
          local_1b8.fpclass = cpp_dec_float_finite;
          local_1b8.prec_elem = 0x1c;
          local_1b8.data._M_elems[0] = 0;
          local_1b8.data._M_elems[1] = 0;
          local_1b8.data._M_elems[2] = 0;
          local_1b8.data._M_elems[3] = 0;
          local_1b8.data._M_elems[4] = 0;
          local_1b8.data._M_elems[5] = 0;
          local_1b8.data._M_elems[6] = 0;
          local_1b8.data._M_elems[7] = 0;
          local_1b8.data._M_elems[8] = 0;
          local_1b8.data._M_elems[9] = 0;
          local_1b8.data._M_elems[10] = 0;
          local_1b8.data._M_elems[0xb] = 0;
          local_1b8.data._M_elems[0xc] = 0;
          local_1b8.data._M_elems[0xd] = 0;
          local_1b8.data._M_elems[0xe] = 0;
          local_1b8.data._M_elems[0xf] = 0;
          local_1b8.data._M_elems[0x10] = 0;
          local_1b8.data._M_elems[0x11] = 0;
          local_1b8.data._M_elems[0x12] = 0;
          local_1b8.data._M_elems[0x13] = 0;
          local_1b8.data._M_elems[0x14] = 0;
          local_1b8.data._M_elems[0x15] = 0;
          local_1b8.data._M_elems[0x16] = 0;
          local_1b8.data._M_elems[0x17] = 0;
          local_1b8.data._M_elems[0x18] = 0;
          local_1b8.data._M_elems[0x19] = 0;
          local_1b8.data._M_elems._104_5_ = 0;
          local_1b8.data._M_elems[0x1b]._1_3_ = 0;
          local_1b8.exp = 0;
          local_1b8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                    (&local_130,(long)(this->u).col.used,(type *)0x0);
          if (&local_1b8 != &pnVar14->m_backend) {
            pcVar15 = &local_1b8;
            for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
              (pcVar15->data)._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
              pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar14 + (ulong)bVar20 * -8 + 4);
              pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar20 * -8 + 4);
            }
            local_1b8.exp = (this->colMemMult).m_backend.exp;
            local_1b8.neg = (this->colMemMult).m_backend.neg;
            local_1b8.fpclass = (this->colMemMult).m_backend.fpclass;
            local_1b8.prec_elem = (this->colMemMult).m_backend.prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&local_1b8,&local_130);
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                    (&local_130,(long)len,(type *)0x0);
          pcVar15 = &local_1b8;
          pcVar17 = &local_b0;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pcVar17->data)._M_elems[0] = (pcVar15->data)._M_elems[0];
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar20 * -8 + 4);
            pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar20 * -8 + 4);
          }
          local_b0.exp = local_1b8.exp;
          local_b0.neg = local_1b8.neg;
          local_b0.fpclass = local_1b8.fpclass;
          local_b0.prec_elem = local_1b8.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    (&local_b0,&local_130);
          lVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                   extract_signed_long_long(&local_b0);
          lVar11 = -0x80000000;
          if (-0x80000000 < lVar10) {
            lVar11 = lVar10;
          }
          if (0x7ffffffe < lVar11) {
            lVar11 = 0x7fffffff;
          }
          forestMinColMem(this,(int)lVar11);
        }
      }
    }
    piVar19 = &(this->u).col.used;
    *piVar19 = *piVar19 + iVar8;
    (this->u).col.max[p_col] = len;
  }
  else {
    if ((this->u).col.size - (this->u).col.used < len) {
      forestPackColumns(this);
      pnVar14 = &this->colMemMult;
      local_1b8.fpclass = cpp_dec_float_finite;
      local_1b8.prec_elem = 0x1c;
      local_1b8.data._M_elems[0] = 0;
      local_1b8.data._M_elems[1] = 0;
      local_1b8.data._M_elems[2] = 0;
      local_1b8.data._M_elems[3] = 0;
      local_1b8.data._M_elems[4] = 0;
      local_1b8.data._M_elems[5] = 0;
      local_1b8.data._M_elems[6] = 0;
      local_1b8.data._M_elems[7] = 0;
      local_1b8.data._M_elems[8] = 0;
      local_1b8.data._M_elems[9] = 0;
      local_1b8.data._M_elems[10] = 0;
      local_1b8.data._M_elems[0xb] = 0;
      local_1b8.data._M_elems[0xc] = 0;
      local_1b8.data._M_elems[0xd] = 0;
      local_1b8.data._M_elems[0xe] = 0;
      local_1b8.data._M_elems[0xf] = 0;
      local_1b8.data._M_elems[0x10] = 0;
      local_1b8.data._M_elems[0x11] = 0;
      local_1b8.data._M_elems[0x12] = 0;
      local_1b8.data._M_elems[0x13] = 0;
      local_1b8.data._M_elems[0x14] = 0;
      local_1b8.data._M_elems[0x15] = 0;
      local_1b8.data._M_elems[0x16] = 0;
      local_1b8.data._M_elems[0x17] = 0;
      local_1b8.data._M_elems[0x18] = 0;
      local_1b8.data._M_elems[0x19] = 0;
      local_1b8.data._M_elems._104_5_ = 0;
      local_1b8.data._M_elems[0x1b]._1_3_ = 0;
      local_1b8.exp = 0;
      local_1b8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&local_130,(long)(this->u).col.used,(type *)0x0);
      if (&local_1b8 != &pnVar14->m_backend) {
        pnVar13 = pnVar14;
        pcVar15 = &local_1b8;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          (pcVar15->data)._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
          pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar13 + (ulong)bVar20 * -8 + 4);
          pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar20 * -8 + 4);
        }
        local_1b8.exp = (this->colMemMult).m_backend.exp;
        local_1b8.neg = (this->colMemMult).m_backend.neg;
        local_1b8.fpclass = (this->colMemMult).m_backend.fpclass;
        local_1b8.prec_elem = (this->colMemMult).m_backend.prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&local_1b8,&local_130);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&local_130,(long)len,(type *)0x0);
      pcVar15 = &local_1b8;
      pcVar17 = &local_b0;
      for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
        (pcVar17->data)._M_elems[0] = (pcVar15->data)._M_elems[0];
        pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar20 * -8 + 4);
        pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar20 * -8 + 4);
      }
      local_b0.exp = local_1b8.exp;
      local_b0.neg = local_1b8.neg;
      local_b0.fpclass = local_1b8.fpclass;
      local_b0.prec_elem = local_1b8.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                (&local_b0,&local_130);
      if (local_b0.fpclass != cpp_dec_float_NaN) {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  (&local_130,(long)(this->u).col.size,(type *)0x0);
        iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&local_b0,&local_130);
        if (0 < iVar8) {
          local_1b8.fpclass = cpp_dec_float_finite;
          local_1b8.prec_elem = 0x1c;
          local_1b8.data._M_elems[0] = 0;
          local_1b8.data._M_elems[1] = 0;
          local_1b8.data._M_elems[2] = 0;
          local_1b8.data._M_elems[3] = 0;
          local_1b8.data._M_elems[4] = 0;
          local_1b8.data._M_elems[5] = 0;
          local_1b8.data._M_elems[6] = 0;
          local_1b8.data._M_elems[7] = 0;
          local_1b8.data._M_elems[8] = 0;
          local_1b8.data._M_elems[9] = 0;
          local_1b8.data._M_elems[10] = 0;
          local_1b8.data._M_elems[0xb] = 0;
          local_1b8.data._M_elems[0xc] = 0;
          local_1b8.data._M_elems[0xd] = 0;
          local_1b8.data._M_elems[0xe] = 0;
          local_1b8.data._M_elems[0xf] = 0;
          local_1b8.data._M_elems[0x10] = 0;
          local_1b8.data._M_elems[0x11] = 0;
          local_1b8.data._M_elems[0x12] = 0;
          local_1b8.data._M_elems[0x13] = 0;
          local_1b8.data._M_elems[0x14] = 0;
          local_1b8.data._M_elems[0x15] = 0;
          local_1b8.data._M_elems[0x16] = 0;
          local_1b8.data._M_elems[0x17] = 0;
          local_1b8.data._M_elems[0x18] = 0;
          local_1b8.data._M_elems[0x19] = 0;
          local_1b8.data._M_elems._104_5_ = 0;
          local_1b8.data._M_elems[0x1b]._1_3_ = 0;
          local_1b8.exp = 0;
          local_1b8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                    (&local_130,(long)(this->u).col.used,(type *)0x0);
          if (&local_1b8 != &pnVar14->m_backend) {
            pcVar15 = &local_1b8;
            for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
              (pcVar15->data)._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
              pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar14 + (ulong)bVar20 * -8 + 4);
              pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar20 * -8 + 4);
            }
            local_1b8.exp = (this->colMemMult).m_backend.exp;
            local_1b8.neg = (this->colMemMult).m_backend.neg;
            local_1b8.fpclass = (this->colMemMult).m_backend.fpclass;
            local_1b8.prec_elem = (this->colMemMult).m_backend.prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&local_1b8,&local_130);
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                    (&local_130,(long)len,(type *)0x0);
          pcVar15 = &local_1b8;
          pcVar17 = &local_b0;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pcVar17->data)._M_elems[0] = (pcVar15->data)._M_elems[0];
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar20 * -8 + 4);
            pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar20 * -8 + 4);
          }
          local_b0.exp = local_1b8.exp;
          local_b0.neg = local_1b8.neg;
          local_b0.fpclass = local_1b8.fpclass;
          local_b0.prec_elem = local_1b8.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    (&local_b0,&local_130);
          lVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                   extract_signed_long_long(&local_b0);
          lVar11 = -0x80000000;
          if (-0x80000000 < lVar10) {
            lVar11 = lVar10;
          }
          if (0x7ffffffe < lVar11) {
            lVar11 = 0x7fffffff;
          }
          forestMinColMem(this,(int)lVar11);
        }
      }
    }
    iVar8 = (this->u).col.used;
    piVar19 = (this->u).col.start;
    iVar9 = piVar19[p_col];
    iVar4 = (this->u).col.len[p_col];
    piVar19[p_col] = iVar8;
    (this->u).col.used = iVar8 + len;
    piVar19 = (this->u).col.max;
    pDVar1 = (this->u).col.elem + p_col;
    pDVar5 = pDVar1->prev;
    piVar19[pDVar5->idx] = piVar19[pDVar5->idx] + piVar19[p_col];
    piVar19[p_col] = len;
    pDVar6 = pDVar1->next;
    pDVar6->prev = pDVar5;
    pDVar5->next = pDVar6;
    pDVar5 = (this->u).col.list.prev;
    pDVar6 = pDVar5->next;
    pDVar1->next = pDVar6;
    pDVar6->prev = pDVar1;
    pDVar1->prev = pDVar5;
    pDVar5->next = pDVar1;
    if (0 < iVar4) {
      piVar7 = (this->u).col.idx;
      pfVar18 = &(((this->u).col.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->m_backend).fpclass;
      piVar19 = piVar7 + iVar8;
      lVar11 = (long)iVar9;
      do {
        pfVar2 = pfVar18 + (long)iVar9 * 0x20;
        pfVar3 = pfVar18 + (long)iVar8 * 0x20 + -0x1e;
        pcVar15 = (cpp_dec_float<200U,_int,_void> *)(pfVar2 + -0x1e);
        pfVar16 = pfVar3;
        for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
          *pfVar16 = (pcVar15->data)._M_elems[0];
          pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar20 * -8 + 4);
          pfVar16 = pfVar16 + (ulong)bVar20 * -2 + 1;
        }
        pfVar3[0x1c] = pfVar2[-2];
        *(bool *)(pfVar3 + 0x1d) = *(bool *)(pfVar2 + -1);
        *(undefined8 *)(pfVar3 + 0x1e) = *(undefined8 *)pfVar2;
        *piVar19 = piVar7[lVar11];
        lVar11 = lVar11 + 1;
        pfVar18 = pfVar18 + 0x20;
        piVar19 = piVar19 + 1;
      } while (lVar11 < iVar4 + iVar9);
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::forestReMaxCol(int p_col, int len)
{
   assert(u.col.max[p_col] < len);

   if(u.col.elem[p_col].next == &(u.col.list))      /* last in column file */
   {
      int delta = len - u.col.max[p_col];

      if(delta > u.col.size - u.col.used)
      {
         forestPackColumns();
         delta = len - u.col.max[p_col];

         if(u.col.size < colMemMult * u.col.used + len)
            forestMinColMem(int(colMemMult * u.col.used + len));
      }

      assert(delta <= u.col.size - u.col.used

             && "ERROR: could not allocate memory for column file");

      u.col.used += delta;
      u.col.max[p_col] = len;
   }

   else                        /* column must be moved to end of column file */
   {
      int i, j, k;
      int* idx;
      R* val;
      Dring* ring;

      if(len > u.col.size - u.col.used)
      {
         forestPackColumns();

         if(u.col.size < colMemMult * u.col.used + len)
            forestMinColMem(int(colMemMult * u.col.used + len));
      }

      assert(len <= u.col.size - u.col.used

             && "ERROR: could not allocate memory for column file");

      j = u.col.used;
      i = u.col.start[p_col];
      k = u.col.len[p_col] + i;
      u.col.start[p_col] = j;
      u.col.used += len;

      u.col.max[u.col.elem[p_col].prev->idx] += u.col.max[p_col];
      u.col.max[p_col] = len;
      removeDR(u.col.elem[p_col]);
      ring = u.col.list.prev;
      init2DR(u.col.elem[p_col], *ring);

      idx = u.col.idx;
      val = u.col.val.data();

      for(; i < k; ++i)
      {
         val[j] = val[i];
         idx[j++] = idx[i];
      }
   }
}